

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcParser::create_scope_local_symtab(CTcParser *this)

{
  CTcPrsSymtab *pCVar1;
  CTcPrsSymtab *in_RDI;
  CTcPrsSymtab *unaff_retaddr;
  CTcPrsSymtab *parent_scope;
  
  if (in_RDI[5].parent_ == (CTcPrsSymtab *)in_RDI[5].hashtab_) {
    parent_scope = in_RDI;
    pCVar1 = (CTcPrsSymtab *)CTcPrsSymtab::operator_new(0x2b958d);
    CTcPrsSymtab::CTcPrsSymtab(unaff_retaddr,parent_scope);
    in_RDI[5].parent_ = pCVar1;
  }
  return;
}

Assistant:

void CTcParser::create_scope_local_symtab()
{
    /* 
     *   if our symbol table is the same as the enclosing symbol table, we
     *   must create our own table 
     */
    if (local_symtab_ == enclosing_local_symtab_)        
    {
        /* 
         *   Create our own local symbol table, replacing the current one
         *   - we saved the enclosing one already when we entered the
         *   scope, so we'll restore it on our way out.  The new local
         *   symbol table has the enclosing symbol table as its parent
         *   scope.  
         */
        local_symtab_ = new CTcPrsSymtab(local_symtab_);
    }
}